

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

LinearQuantizationParams * __thiscall
CoreML::Specification::QuantizationParams::mutable_linearquantization(QuantizationParams *this)

{
  LinearQuantizationParams *this_00;
  
  if (this->_oneof_case_[0] == 0x65) {
    this_00 = (this->QuantizationType_).linearquantization_;
  }
  else {
    clear_QuantizationType(this);
    this->_oneof_case_[0] = 0x65;
    this_00 = (LinearQuantizationParams *)operator_new(0x40);
    LinearQuantizationParams::LinearQuantizationParams(this_00);
    (this->QuantizationType_).linearquantization_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::LinearQuantizationParams* QuantizationParams::mutable_linearquantization() {
  if (!has_linearquantization()) {
    clear_QuantizationType();
    set_has_linearquantization();
    QuantizationType_.linearquantization_ = new ::CoreML::Specification::LinearQuantizationParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.QuantizationParams.linearQuantization)
  return QuantizationType_.linearquantization_;
}